

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase739::run(TestCase739 *this)

{
  CapTableBuilder **this_00;
  Client *this_01;
  undefined8 uVar1;
  RequestHook *pRVar2;
  long *plVar3;
  CapTableBuilder *pCVar4;
  undefined8 uVar5;
  CapTableReader *pCVar6;
  ClientHook *pCVar7;
  long lVar8;
  SegmentBuilder *node;
  WirePointer *pWVar9;
  byte bVar10;
  uint uVar11;
  undefined8 *__n;
  char *__n_00;
  ulong __n_01;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar12;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  Own<capnp::ClientHook,_std::nullptr_t> OVar13;
  DebugComparison<int,_unsigned_int> _kjCondition;
  int callerCallCount;
  DebugComparison<int,_unsigned_int> _kjCondition_2;
  int calleeCallCount;
  Response<capnproto_test::capnp::test::TestTailCallee::TailResult> response;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall2;
  Client callee;
  WaitScope waitScope;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall1;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall0;
  RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult> promise;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  request;
  EventLoop loop;
  undefined1 local_3e8 [24];
  WirePointer *local_3d0;
  uint local_3c8;
  Disposer *local_3c0;
  RequestHook *local_3b8;
  long *local_3b0;
  undefined1 local_39c [8];
  uint uStack_394;
  undefined8 uStack_390;
  long local_388;
  undefined4 local_380;
  undefined1 local_36c [4];
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_368;
  long *local_330;
  undefined1 local_328 [16];
  undefined1 local_318 [56];
  undefined8 *local_2e0;
  CapTableReader *pCStack_2d8;
  pointer_____offset_0x10___ *local_2d0;
  Client local_2c8;
  EventLoop *local_2b8;
  undefined4 local_2b0;
  long local_2a8;
  undefined8 uStack_2a0;
  undefined1 local_298 [16];
  ClientHook *pCStack_288;
  undefined1 local_280 [56];
  undefined8 *local_248;
  long *local_240;
  long local_238;
  undefined8 uStack_230;
  undefined8 *local_228;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  local_220;
  undefined *puStack_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  undefined *puStack_1d0;
  undefined8 local_1c8;
  char *local_1c0;
  undefined *puStack_1b8;
  undefined8 local_1b0;
  char *local_1a8;
  undefined *puStack_1a0;
  undefined8 local_198;
  char *local_190;
  undefined *puStack_188;
  undefined8 local_180;
  char *local_178;
  undefined *puStack_170;
  undefined8 local_168;
  char *local_160;
  undefined *puStack_158;
  undefined8 local_150;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  local_148;
  Maybe<capnp::MessageSize> local_108;
  Maybe<capnp::MessageSize> local_f0;
  Maybe<capnp::MessageSize> local_d8;
  Maybe<capnp::MessageSize> local_c0;
  EventLoop local_a8;
  
  kj::EventLoop::EventLoop(&local_a8);
  local_2b0 = 0xffffffff;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = &local_a8;
  kj::EventLoop::enterScope(&local_a8);
  local_36c = (undefined1  [4])0x0;
  local_39c._0_4_ = 0;
  kj::heap<capnp::_::TestTailCalleeImpl,int&>((kj *)local_3e8,(int *)local_36c);
  local_368.super_Builder._builder.segment = (SegmentBuilder *)local_3e8._0_8_;
  local_368.super_Builder._builder.capTable = (CapTableBuilder *)(local_3e8._8_8_ + 0x10);
  if ((ClientHook *)local_3e8._8_8_ == (ClientHook *)0x0) {
    local_368.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  }
  local_3e8._8_8_ = (ClientHook *)0x0;
  OVar13 = Capability::Client::makeLocalClient
                     (&local_2c8,(Own<capnp::Capability::Server,_std::nullptr_t> *)(local_36c + 4));
  pCVar4 = local_368.super_Builder._builder.capTable;
  if ((ClientHook *)local_368.super_Builder._builder.capTable != (ClientHook *)0x0) {
    local_368.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_368.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_368.super_Builder._builder.segment,
      (_func_int *)
      ((long)&pCVar4->super_CapTableReader +
      (long)(pCVar4->super_CapTableReader)._vptr_CapTableReader[-2]),OVar13.ptr);
  }
  uVar1 = local_3e8._8_8_;
  local_2d0 = &capnproto_test::capnp::test::TestTailCallee::Client::typeinfo;
  if ((ClientHook *)local_3e8._8_8_ != (ClientHook *)0x0) {
    local_3e8._8_8_ = (ClientHook *)0x0;
    (*(code *)((SegmentReader *)local_3e8._0_8_)->arena->_vptr_Arena)
              (local_3e8._0_8_,
               (_func_int *)((long)(_func_int ***)uVar1 + (long)(*(_func_int ***)uVar1)[-2]));
  }
  local_3e8._8_8_ = operator_new(0x28);
  ((Maybe<capnp::ClientHook_&> *)&((ClientHook *)local_3e8._8_8_)->brand)->ptr = (ClientHook *)0x0;
  ((ClientHook *)(local_3e8._8_8_ + 0x10))->_vptr_ClientHook = (_func_int **)0x6c4d38;
  *(undefined1 *)
   &((Maybe<capnp::ClientHook_&> *)&((ClientHook *)(local_3e8._8_8_ + 0x10))->brand)->ptr = 0;
  ((ClientHook *)local_3e8._8_8_)->_vptr_ClientHook = (_func_int **)&PTR_dispatchCall_006b5790;
  ((ClientHook *)(local_3e8._8_8_ + 0x20))->_vptr_ClientHook = (_func_int **)local_39c;
  __n = &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl>::instance;
  local_3e8._0_8_ =
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestTailCallerDynamicImpl>::instance;
  OVar13 = Capability::Client::makeLocalClient
                     ((Client *)(local_36c + 4),
                      (Own<capnp::Capability::Server,_std::nullptr_t> *)local_3e8);
  uVar1 = local_3e8._8_8_;
  if ((ClientHook *)local_3e8._8_8_ != (ClientHook *)0x0) {
    local_3e8._8_8_ = (ClientHook *)0x0;
    (***(_func_int ***)local_3e8._0_8_)
              (local_3e8._0_8_,
               (_func_int *)((long)(_func_int ***)uVar1 + (long)(*(_func_int ***)uVar1)[-2]),
               OVar13.ptr);
  }
  local_368.super_Builder._builder.data = schemas::s_870bf40110ce3035 + 0x48;
  (*((local_368.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader[4])
            (local_3e8);
  pCVar4 = local_368.super_Builder._builder.capTable;
  local_298._8_4_ = local_3e8._0_4_;
  local_298._12_4_ = local_3e8._4_4_;
  pCStack_288 = (ClientHook *)local_3e8._8_8_;
  local_298._0_8_ = &capnproto_test::capnp::test::TestTailCaller::Client::typeinfo;
  if ((ClientHook *)local_368.super_Builder._builder.capTable != (ClientHook *)0x0) {
    local_368.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_368.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_368.super_Builder._builder.segment,
      (_func_int *)
      ((long)&pCVar4->super_CapTableReader +
      (long)(pCVar4->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  local_c0.ptr.isSet = false;
  capnproto_test::capnp::test::TestTailCaller::Client::fooRequest
            (&local_148,(Client *)local_298,&local_c0);
  *(undefined4 *)local_148.super_Builder._builder.data = 0x1c8;
  local_368.super_Builder._builder.segment =
       (SegmentBuilder *)
       CONCAT44(local_148.super_Builder._builder.segment._4_4_,
                local_148.super_Builder._builder.segment._0_4_);
  local_368.super_Builder._builder.capTable =
       (CapTableBuilder *)
       CONCAT44(local_148.super_Builder._builder.capTable._4_4_,
                local_148.super_Builder._builder.capTable._0_4_);
  local_368.super_Builder._builder.data = local_148.super_Builder._builder.pointers;
  (**(code **)(**(long **)((long)&local_2c8.hook.disposer + (long)local_2d0[-3]) + 0x20))(local_3e8)
  ;
  PointerBuilder::setCapability
            ((PointerBuilder *)(local_36c + 4),(Own<capnp::ClientHook,_std::nullptr_t> *)local_3e8);
  uVar1 = local_3e8._8_8_;
  pvVar12 = extraout_RDX;
  if ((ClientHook *)local_3e8._8_8_ != (ClientHook *)0x0) {
    local_3e8._8_8_ = (ClientHook *)0x0;
    (***(_func_int ***)local_3e8._0_8_)
              (local_3e8._0_8_,
               (_func_int *)((long)(_func_int ***)uVar1 + (long)(*(_func_int ***)uVar1)[-2]));
    pvVar12 = extraout_RDX_00;
  }
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::send(&local_220,(int)&local_148,pvVar12,(size_t)__n,in_R8D);
  this_00 = &local_220.super_Builder._builder.capTable;
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            ((Client *)local_3e8,(Pipeline *)this_00);
  local_d8.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)(local_36c + 4),(Client *)local_3e8,&local_d8);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)(local_280 + 0x30),(int)local_36c + 4,__buf,(size_t)__n,in_R8D);
  pRVar2 = local_368.hook.ptr;
  if (local_368.hook.ptr != (RequestHook *)0x0) {
    local_368.hook.ptr = (RequestHook *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_368.hook.disposer._4_4_,(uint)local_368.hook.disposer)
    )((undefined8 *)CONCAT44(local_368.hook.disposer._4_4_,(uint)local_368.hook.disposer),
      (long)pRVar2 + *(long *)(*(long *)pRVar2 + -0x10));
  }
  uVar1 = local_3e8._16_8_;
  if ((long *)local_3e8._16_8_ != (long *)0x0) {
    local_3e8._16_8_ = (long *)0x0;
    (***(_func_int ***)local_3e8._8_8_)(local_3e8._8_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_158 = &DAT_004d6248;
  local_150 = 0x13000002f7;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_> *)
             (local_36c + 4),&local_220);
  local_3e8._4_4_ = 0;
  if (0x1f < local_368.super_Builder._builder.dataSize) {
    local_3e8._4_4_ = ((WireValue<uint32_t>_conflict *)local_368.super_Builder._builder.data)->value
    ;
  }
  local_3e8._0_4_ = 0x1c8;
  local_3e8._8_8_ = " == ";
  local_3e8._16_8_ = &DAT_00000005;
  if ((local_3e8._4_4_ != 0x1c8) && (kj::_::Debug::minSeverity < 3)) {
    uVar11 = 0;
    local_280._0_4_ = 0x1c8;
    if (0x1f < local_368.super_Builder._builder.dataSize) {
      uVar11 = ((WireValue<uint32_t>_conflict *)local_368.super_Builder._builder.data)->value;
    }
    local_318._0_4_ = uVar11;
    in_R8D = 0x4d6c8d;
    local_3d0._0_1_ = local_3e8._4_4_ == 0x1c8;
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2f8,ERROR,
               "\"failed: expected \" \"(456) == (response.getI())\", _kjCondition, 456, response.getI()"
               ,(char (*) [44])"failed: expected (456) == (response.getI())",
               (DebugComparison<int,_unsigned_int> *)local_3e8,(int *)local_280,(uint *)local_318);
  }
  __n_00 = (char *)0x0;
  if (0x1f < local_368.super_Builder._builder.dataSize) {
    __n_00 = (char *)(ulong)((WireValue<uint32_t>_conflict *)local_368.super_Builder._builder.data)
                            ->value;
  }
  local_3e8._4_4_ = SUB84(__n_00,0);
  local_3e8._0_4_ = 0x1c8;
  local_3e8._8_8_ = " == ";
  local_3e8._16_8_ = &DAT_00000005;
  local_3d0 = (WirePointer *)CONCAT71(local_3d0._1_7_,local_3e8._4_4_ == 0x1c8);
  if ((local_3e8._4_4_ != 0x1c8) && (kj::_::Debug::minSeverity < 3)) {
    uVar11 = 0;
    local_280._0_4_ = 0x1c8;
    if (0x1f < local_368.super_Builder._builder.dataSize) {
      uVar11 = ((WireValue<uint32_t>_conflict *)local_368.super_Builder._builder.data)->value;
    }
    local_318._0_4_ = uVar11;
    __n_00 = 
    "\"failed: expected \" \"(456) == (response.getI())\", _kjCondition, 456, response.getI()";
    in_R8D = 0x4d6c8d;
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2f9,ERROR,
               "\"failed: expected \" \"(456) == (response.getI())\", _kjCondition, 456, response.getI()"
               ,(char (*) [44])"failed: expected (456) == (response.getI())",
               (DebugComparison<int,_unsigned_int> *)local_3e8,(int *)local_280,(uint *)local_318);
  }
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            ((Client *)local_318,(Pipeline *)this_00);
  local_f0.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_3e8,(Client *)local_318,&local_f0);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_280,(int)local_3e8,__buf_00,(size_t)__n_00,in_R8D);
  pRVar2 = local_3b8;
  if (local_3b8 != (RequestHook *)0x0) {
    local_3b8 = (RequestHook *)0x0;
    (**local_3c0->_vptr_Disposer)
              (local_3c0,
               (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2])
              );
  }
  uVar1 = local_318._16_8_;
  if ((long *)local_318._16_8_ != (long *)0x0) {
    local_318._16_8_ = (long *)0x0;
    (**((CapTableReader *)local_318._8_8_)->_vptr_CapTableReader)
              (local_318._8_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
  }
  local_388 = 0;
  if (1 < local_368.super_Builder._builder.pointerCount) {
    local_388 = (long)local_368.super_Builder._builder.pointers + 8;
  }
  __n_01 = 0x7fffffff;
  if (1 < local_368.super_Builder._builder.pointerCount) {
    __n_01 = (ulong)(uint)local_368.hook.disposer;
  }
  else {
    local_368.super_Builder._builder.segment._0_4_ = 0;
    local_368.super_Builder._builder.segment._4_4_ = 0;
    local_368.super_Builder._builder.capTable._0_4_ = 0;
    local_368.super_Builder._builder.capTable._4_4_ = 0;
  }
  uStack_390 = (char *)CONCAT44(local_368.super_Builder._builder.capTable._4_4_,
                                local_368.super_Builder._builder.capTable._0_4_);
  local_380 = (undefined4)__n_01;
  local_39c._4_4_ = local_368.super_Builder._builder.segment._0_4_;
  uStack_394 = local_368.super_Builder._builder.segment._4_4_;
  PointerReader::getCapability((PointerReader *)local_328);
  local_2e0 = (undefined8 *)CONCAT44(local_328._4_4_,local_328._0_4_);
  this_01 = (Client *)(local_318 + 0x30);
  pCStack_2d8 = (CapTableReader *)local_328._8_8_;
  local_318._48_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
  local_108.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            ((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
              *)local_3e8,this_01,&local_108);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)local_318,(int)local_3e8,__buf_01,__n_01,in_R8D);
  pRVar2 = local_3b8;
  if (local_3b8 != (RequestHook *)0x0) {
    local_3b8 = (RequestHook *)0x0;
    (**local_3c0->_vptr_Disposer)
              (local_3c0,
               (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2])
              );
  }
  pCVar6 = pCStack_2d8;
  if (pCStack_2d8 != (CapTableReader *)0x0) {
    pCStack_2d8 = (CapTableReader *)0x0;
    (**(code **)*local_2e0)
              (local_2e0,
               (_func_int *)
               ((long)&pCVar6->_vptr_CapTableReader + (long)pCVar6->_vptr_CapTableReader[-2]));
  }
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_170 = &DAT_004d6248;
  local_168 = 0x35000002ff;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_3e8,local_280 + 0x30);
  plVar3 = local_3b0;
  uStack_394 = 0;
  if (0x1f < local_3c8) {
    uStack_394 = *(uint *)local_3e8._16_8_;
  }
  local_39c._4_4_ = 0;
  uStack_390 = " == ";
  local_388 = 5;
  local_380 = CONCAT31(local_380._1_3_,uStack_394 == 0);
  bVar10 = uStack_394 == 0;
  if (local_3b0 != (long *)0x0) {
    local_3b0 = (long *)0x0;
    (**local_3b8->_vptr_RequestHook)(local_3b8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    bVar10 = (byte)local_380;
  }
  if (((bVar10 & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    local_318._48_8_ = local_318._48_8_ & 0xffffffff00000000;
    local_190 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
    ;
    puStack_188 = &DAT_004d6248;
    local_180 = 0x35000002ff;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_3e8,local_280 + 0x30);
    local_328._0_4_ = 0;
    if (0x1f < local_3c8) {
      local_328._0_4_ = *(undefined4 *)local_3e8._16_8_;
    }
    kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x2ff,ERROR,
               "\"failed: expected \" \"(0) == (dependentCall0.wait(waitScope).getN())\", _kjCondition, 0, dependentCall0.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (0) == (dependentCall0.wait(waitScope).getN())",
               (DebugComparison<int,_unsigned_int> *)(local_39c + 4),(int *)this_01,
               (uint *)local_328);
    plVar3 = local_3b0;
    if (local_3b0 != (long *)0x0) {
      local_3b0 = (long *)0x0;
      (**local_3b8->_vptr_RequestHook)(local_3b8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_1a0 = &DAT_004d6248;
  local_198 = 0x3500000300;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_3e8,local_280);
  plVar3 = local_3b0;
  uStack_394 = 0;
  if (0x1f < local_3c8) {
    uStack_394 = *(uint *)local_3e8._16_8_;
  }
  local_39c._4_4_ = 1;
  uStack_390 = " == ";
  local_388 = 5;
  local_380 = CONCAT31(local_380._1_3_,uStack_394 == 1);
  bVar10 = uStack_394 == 1;
  if (local_3b0 != (long *)0x0) {
    local_3b0 = (long *)0x0;
    (**local_3b8->_vptr_RequestHook)(local_3b8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    bVar10 = (byte)local_380;
  }
  if (((bVar10 & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    local_318._48_4_ = 1;
    local_1c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
    ;
    puStack_1b8 = &DAT_004d6248;
    local_1b0 = 0x3500000300;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_3e8,local_280);
    local_328._0_4_ = 0;
    if (0x1f < local_3c8) {
      local_328._0_4_ = *(undefined4 *)local_3e8._16_8_;
    }
    kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x300,ERROR,
               "\"failed: expected \" \"(1) == (dependentCall1.wait(waitScope).getN())\", _kjCondition, 1, dependentCall1.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (1) == (dependentCall1.wait(waitScope).getN())",
               (DebugComparison<int,_unsigned_int> *)(local_39c + 4),(int *)this_01,
               (uint *)local_328);
    plVar3 = local_3b0;
    if (local_3b0 != (long *)0x0) {
      local_3b0 = (long *)0x0;
      (**local_3b8->_vptr_RequestHook)(local_3b8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
  ;
  puStack_1d0 = &DAT_004d6248;
  local_1c8 = 0x3500000301;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_3e8,local_318);
  plVar3 = local_3b0;
  uStack_394 = 0;
  if (0x1f < local_3c8) {
    uStack_394 = *(uint *)local_3e8._16_8_;
  }
  local_39c._4_4_ = 2;
  uStack_390 = " == ";
  local_388 = 5;
  local_380 = CONCAT31(local_380._1_3_,uStack_394 == 2);
  bVar10 = uStack_394 == 2;
  if (local_3b0 != (long *)0x0) {
    local_3b0 = (long *)0x0;
    (**local_3b8->_vptr_RequestHook)(local_3b8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    bVar10 = (byte)local_380;
  }
  if (kj::_::Debug::minSeverity < 3 && (bVar10 & 1) == 0) {
    local_318._48_4_ = 2;
    local_220.hook.ptr = (RequestHook *)0x4d61c0;
    puStack_1e8 = &DAT_004d6248;
    local_1e0 = 0x3500000301;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)local_3e8,local_318);
    local_328._0_4_ = 0;
    if (0x1f < local_3c8) {
      local_328._0_4_ = *(undefined4 *)local_3e8._16_8_;
    }
    kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x301,ERROR,
               "\"failed: expected \" \"(2) == (dependentCall2.wait(waitScope).getN())\", _kjCondition, 2, dependentCall2.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (2) == (dependentCall2.wait(waitScope).getN())",
               (DebugComparison<int,_unsigned_int> *)(local_39c + 4),(int *)this_01,
               (uint *)local_328);
    plVar3 = local_3b0;
    if (local_3b0 != (long *)0x0) {
      local_3b0 = (long *)0x0;
      (**local_3b8->_vptr_RequestHook)(local_3b8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  local_3e8._0_4_ = 1;
  local_3e8._8_8_ = local_36c;
  local_3e8._16_8_ = " == ";
  local_3d0 = (WirePointer *)&DAT_00000005;
  if (kj::_::Debug::minSeverity < 3 && local_36c != (undefined1  [4])0x1) {
    local_39c._4_4_ = 1;
    local_3c8._0_1_ = local_36c == (undefined1  [4])0x1;
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x303,ERROR,
               "\"failed: expected \" \"(1) == (calleeCallCount)\", _kjCondition, 1, calleeCallCount"
               ,(char (*) [42])"failed: expected (1) == (calleeCallCount)",
               (DebugComparison<int,_int_&> *)local_3e8,(int *)(local_39c + 4),
               (int *)local_3e8._8_8_);
  }
  local_3e8._0_4_ = 1;
  local_3e8._16_8_ = " == ";
  local_3d0 = (WirePointer *)&DAT_00000005;
  local_3c8 = CONCAT31(local_3c8._1_3_,local_39c._0_4_ == 1);
  local_3e8._8_8_ = (ClientHook *)local_39c;
  if ((local_39c._0_4_ != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_39c._4_4_ = 1;
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x304,ERROR,
               "\"failed: expected \" \"(1) == (callerCallCount)\", _kjCondition, 1, callerCallCount"
               ,(char (*) [42])"failed: expected (1) == (callerCallCount)",
               (DebugComparison<int,_int_&> *)local_3e8,(int *)(local_39c + 4),(int *)local_39c);
  }
  uVar5 = local_318._32_8_;
  uVar1 = local_318._24_8_;
  if ((WirePointer *)local_318._24_8_ != (WirePointer *)0x0) {
    local_318._24_8_ = (WirePointer *)0x0;
    local_318._32_4_ = 0;
    local_318._36_2_ = 0;
    local_318._38_2_ = 0;
    (***(_func_int ***)local_318._40_8_)(local_318._40_8_,uVar1,8,uVar5,uVar5,0);
  }
  uVar1 = local_318._16_8_;
  if ((long *)local_318._16_8_ != (long *)0x0) {
    local_318._16_8_ = (long *)0x0;
    (**((CapTableReader *)local_318._8_8_)->_vptr_CapTableReader)
              (local_318._8_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
  }
  uVar1 = local_318._0_8_;
  if ((SegmentBuilder *)local_318._0_8_ != (SegmentBuilder *)0x0) {
    local_318._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  uVar5 = local_280._32_8_;
  uVar1 = local_280._24_8_;
  if ((WirePointer *)local_280._24_8_ != (WirePointer *)0x0) {
    local_280._24_8_ = (WirePointer *)0x0;
    local_280._32_4_ = 0;
    local_280._36_2_ = 0;
    local_280._38_2_ = 0;
    (***(_func_int ***)local_280._40_8_)(local_280._40_8_,uVar1,8,uVar5,uVar5,0);
  }
  uVar1 = local_280._16_8_;
  if ((long *)local_280._16_8_ != (long *)0x0) {
    local_280._16_8_ = (long *)0x0;
    (**((CapTableReader *)local_280._8_8_)->_vptr_CapTableReader)
              (local_280._8_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
  }
  uVar1 = local_280._0_8_;
  if ((SegmentBuilder *)local_280._0_8_ != (SegmentBuilder *)0x0) {
    local_280._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  plVar3 = local_330;
  if (local_330 != (long *)0x0) {
    local_330 = (long *)0x0;
    (*(code *)*(local_368.hook.ptr)->_vptr_RequestHook)
              (local_368.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  uVar1 = uStack_230;
  lVar8 = local_238;
  if (local_238 != 0) {
    local_238 = 0;
    uStack_230 = 0;
    (**(code **)*local_228)(local_228,lVar8,8,uVar1,uVar1,0);
  }
  plVar3 = local_240;
  if (local_240 != (long *)0x0) {
    local_240 = (long *)0x0;
    (**(code **)*local_248)(local_248,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  uVar1 = local_280._48_8_;
  if ((PromiseArenaMember *)local_280._48_8_ != (PromiseArenaMember *)0x0) {
    local_280._48_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  uVar1 = local_220.super_Builder._builder._32_8_;
  pWVar9 = local_220.super_Builder._builder.pointers;
  if (local_220.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_220.super_Builder._builder.pointers = (WirePointer *)0x0;
    local_220.super_Builder._builder.dataSize = 0;
    local_220.super_Builder._builder.pointerCount = 0;
    local_220.super_Builder._builder._38_2_ = 0;
    (**(local_220.hook.disposer)->_vptr_Disposer)(local_220.hook.disposer,pWVar9,8,uVar1,uVar1,0);
  }
  pvVar12 = local_220.super_Builder._builder.data;
  if ((long *)local_220.super_Builder._builder.data != (long *)0x0) {
    local_220.super_Builder._builder.data = (long *)0x0;
    (**((local_220.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_220.super_Builder._builder.capTable,(long)pvVar12 + *(long *)(*pvVar12 + -0x10)
              );
  }
  node = local_220.super_Builder._builder.segment;
  if (local_220.super_Builder._builder.segment != (SegmentBuilder *)0x0) {
    local_220.super_Builder._builder.segment = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  pRVar2 = local_148.hook.ptr;
  if (local_148.hook.ptr != (RequestHook *)0x0) {
    local_148.hook.ptr = (RequestHook *)0x0;
    (**(local_148.hook.disposer)->_vptr_Disposer)
              (local_148.hook.disposer,
               (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2])
              );
  }
  pCVar7 = pCStack_288;
  if (pCStack_288 != (ClientHook *)0x0) {
    pCStack_288 = (ClientHook *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_298._12_4_,local_298._8_4_))
              ((undefined8 *)CONCAT44(local_298._12_4_,local_298._8_4_),
               (_func_int *)((long)&pCVar7->_vptr_ClientHook + (long)pCVar7->_vptr_ClientHook[-2]));
  }
  pCVar7 = local_2c8.hook.ptr;
  if (local_2c8.hook.ptr != (ClientHook *)0x0) {
    local_2c8.hook.ptr = (ClientHook *)0x0;
    (**(local_2c8.hook.disposer)->_vptr_Disposer)
              (local_2c8.hook.disposer,
               (_func_int *)((long)&pCVar7->_vptr_ClientHook + (long)pCVar7->_vptr_ClientHook[-2]));
  }
  if (local_2a8 == 0) {
    kj::EventLoop::leaveScope(local_2b8);
  }
  kj::EventLoop::~EventLoop(&local_a8);
  return;
}

Assistant:

TEST(Capability, DynamicServerTailCall) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int calleeCallCount = 0;
  int callerCallCount = 0;

  test::TestTailCallee::Client callee(kj::heap<TestTailCalleeImpl>(calleeCallCount));
  test::TestTailCaller::Client caller =
      DynamicCapability::Client(kj::heap<TestTailCallerDynamicImpl>(callerCallCount))
          .castAs<test::TestTailCaller>();

  auto request = caller.fooRequest();
  request.setI(456);
  request.setCallee(callee);

  auto promise = request.send();

  auto dependentCall0 = promise.getC().getCallSequenceRequest().send();

  auto response = promise.wait(waitScope);
  EXPECT_EQ(456, response.getI());
  EXPECT_EQ(456, response.getI());

  auto dependentCall1 = promise.getC().getCallSequenceRequest().send();

  auto dependentCall2 = response.getC().getCallSequenceRequest().send();

  EXPECT_EQ(0, dependentCall0.wait(waitScope).getN());
  EXPECT_EQ(1, dependentCall1.wait(waitScope).getN());
  EXPECT_EQ(2, dependentCall2.wait(waitScope).getN());

  EXPECT_EQ(1, calleeCallCount);
  EXPECT_EQ(1, callerCallCount);
}